

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O3

void __thiscall cpp_sgr::sgr::sgr(sgr *this,SGRCode code)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  SGRCode __val;
  uint __len;
  string __str;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  __val = -code;
  if (0 < (int)code) {
    __val = code;
  }
  __len = 1;
  if (STRIKE < __val) {
    uVar3 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_00103e59;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_00103e59;
      }
      if (uVar2 < 10000) goto LAB_00103e59;
      uVar3 = uVar3 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_00103e59:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)code >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(code >> 0x1f) + (long)local_50),__len,__val);
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)this,local_50,local_48 + (long)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

sgr(const SGRCode code) : sgr(std::to_string(code)) {}